

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

void Abc_NtkLutminConstruct(Abc_Ntk_t *pNtkClp,Abc_Ntk_t *pNtkDec,int nLutSize,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int nLutSize_local;
  Abc_Ntk_t *pNtkDec_local;
  Abc_Ntk_t *pNtkClp_local;
  
  p = Abc_NtkDfs(pNtkClp,0);
  for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p,local_3c);
    iVar1 = Abc_ObjFaninNum(pObj);
    if (nLutSize < iVar1) {
      pAVar2 = Abc_NtkBddDecompose(pNtkDec,pObj,nLutSize,fVerbose);
      (pObj->field_6).pCopy = pAVar2;
    }
    else {
      pAVar2 = Abc_NtkDupObj(pNtkDec,pObj,0);
      (pObj->field_6).pCopy = pAVar2;
      for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_40 < iVar1; local_40 = local_40 + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_40);
        Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar2->field_6).pCopy);
      }
    }
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkLutminConstruct( Abc_Ntk_t * pNtkClp, Abc_Ntk_t * pNtkDec, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    vNodes = Abc_NtkDfs( pNtkClp, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) <= nLutSize )
        {
            pNode->pCopy = Abc_NtkDupObj( pNtkDec, pNode, 0 );
            Abc_ObjForEachFanin( pNode, pFanin, k )
                Abc_ObjAddFanin( pNode->pCopy, pFanin->pCopy );
        }
        else
            pNode->pCopy = Abc_NtkBddDecompose( pNtkDec, pNode, nLutSize, fVerbose );
    }
    Vec_PtrFree( vNodes );
}